

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lock.c
# Opt level: O1

boolean doorlock(obj *otmp,int x,int y)

{
  undefined1 *puVar1;
  byte bVar2;
  ushort uVar3;
  uint uVar4;
  monst *mtmp;
  bool bVar5;
  rm (*parVar6) [21];
  level *plVar7;
  boolean bVar8;
  boolean bVar9;
  trap *ptVar10;
  char *pcVar11;
  char *pcVar12;
  int distance;
  char cVar13;
  xchar local_50;
  xchar local_4c;
  
  plVar7 = level;
  parVar6 = level->locations;
  bVar8 = on_level(&level->z,&dungeon_topology.d_advcal_level);
  if (plVar7->locations[x][y].typ == '\x0f') {
    uVar3 = otmp->otyp;
    if (((1 < uVar3 - 0x186) && (uVar3 != 0x1cc)) && (uVar3 != 0x1c4)) {
      return '\0';
    }
    if (bVar8 == '\0') {
      plVar7->locations[x][y].typ = '\x17';
      *(uint *)&plVar7->locations[x][y].field_0x6 =
           *(uint *)&plVar7->locations[x][y].field_0x6 & 0xffffff0f | 0x40;
    }
    else {
      cvt_sdoor_to_door(parVar6[x] + y,&u.uz);
    }
    newsym(x,y);
    if ((viz_array[y][x] & 2U) != 0) {
      pline("A door appears in the wall!");
    }
    if (otmp->otyp == 0x186) {
      return '\x01';
    }
    if (otmp->otyp == 0x1cc) {
      return '\x01';
    }
  }
  uVar3 = otmp->otyp;
  if (0x1c3 < uVar3) {
    if (uVar3 == 0x1c4) {
LAB_001b6d27:
      if ((bVar8 == '\0') &&
         (uVar4 = *(uint *)&plVar7->locations[x][y].field_0x6, (uVar4 & 0xc0) != 0)) {
        if ((uVar4 >> 8 & 1) == 0) {
          *(uint *)&plVar7->locations[x][y].field_0x6 = uVar4 & 0xfffffe0f | 0x10;
          if (flags.verbose != '\0') {
            if ((viz_array[y][x] & 2U) == 0) {
              if (flags.soundok != '\0') {
                You_hear("a crashing sound.");
              }
            }
            else {
              pline("The door crashes open!");
            }
          }
          unblock_point(x,y);
          newsym(x,y);
          distance = 0x14;
          if (vision_full_recalc != '\0') {
            vision_recalc(0);
          }
          pcVar11 = (char *)0x0;
          bVar5 = true;
          cVar13 = '\x01';
        }
        else {
          mtmp = level->monsters[x][y];
          if ((mtmp == (monst *)0x0) || ((mtmp->field_0x61 & 2) != 0)) {
            if (flags.verbose != '\0') {
              if ((viz_array[y][x] & 2U) == 0) {
                if (flags.soundok != '\0') {
                  You_hear("a distant explosion.");
                }
              }
              else {
                pline("KABOOM!!  You see a door explode.");
              }
            }
          }
          else {
            mb_trapped(mtmp);
          }
          puVar1 = &plVar7->locations[x][y].field_0x6;
          *(uint *)puVar1 = *(uint *)puVar1 & 0xfffffe0f;
          unblock_point(x,y);
          newsym(x,y);
          bVar5 = true;
          distance = 0x28;
          pcVar11 = (char *)0x0;
          cVar13 = '\x01';
        }
        goto LAB_001b6eca;
      }
LAB_001b6dbe:
      pcVar11 = (char *)0x0;
      bVar5 = false;
      distance = 0;
      cVar13 = '\0';
      goto LAB_001b6eca;
    }
    if (uVar3 == 0x1cc) goto LAB_001b6dad;
    if (uVar3 == 0x1cd) goto LAB_001b6ccd;
LAB_001b6c96:
    pcVar11 = (char *)0x0;
    warning("magic (%d) attempted on door.",(ulong)(uint)(int)(short)uVar3);
    cVar13 = '\x01';
    goto LAB_001b6ec1;
  }
  if (uVar3 == 0x186) {
LAB_001b6dad:
    if ((bVar8 != '\0') || (uVar4 = *(uint *)&plVar7->locations[x][y].field_0x6, -1 < (char)uVar4))
    goto LAB_001b6dbe;
    *(uint *)&plVar7->locations[x][y].field_0x6 = uVar4 & 0xffffff0f | 0x40;
    cVar13 = '\x01';
    pcVar11 = "The door unlocks!";
    goto LAB_001b6ec1;
  }
  if (uVar3 == 0x187) goto LAB_001b6d27;
  if (uVar3 != 0x18c) goto LAB_001b6c96;
LAB_001b6ccd:
  bVar9 = on_level(&u.uz,&dungeon_topology.d_rogue_level);
  if (bVar9 != '\0') {
    bVar2 = viz_array[y][x];
    if ((bVar2 & 2) == 0) {
      You_hear("a swoosh.");
    }
    else {
      pline("%s springs up in the older, more primitive doorway.","A cloud of dust");
    }
    bVar8 = obstructed(x,y);
    if (bVar8 != '\0') {
      if ((bVar2 & 2) == 0) {
        return '\0';
      }
      pline("The cloud %s.","quickly dissipates");
      return '\0';
    }
    block_point(x,y);
    plVar7->locations[x][y].typ = '\x0f';
    if ((bVar2 & 2) != 0) {
      pline("The doorway vanishes!");
    }
    newsym(x,y);
    return '\x01';
  }
  bVar9 = obstructed(x,y);
  if (bVar9 != '\0') {
    return '\0';
  }
  ptVar10 = t_at(level,x,y);
  if (ptVar10 != (trap *)0x0) {
    pline("%s springs up in the doorway, but %s.","A cloud of dust","quickly dissipates");
    return '\0';
  }
  cVar13 = '\x01';
  switch(*(uint *)&plVar7->locations[x][y].field_0x6 >> 4 & 0xf) {
  case 0:
    pcVar11 = "A cloud of dust springs up and assembles itself into a door!";
    goto LAB_001b715b;
  case 1:
    pcVar12 = "The broken door reassembles and locks!";
    pcVar11 = "The broken door reassembles!";
    break;
  case 2:
    pcVar12 = "The door swings shut, and locks!";
    pcVar11 = "The door swings shut!";
    break;
  default:
    cVar13 = '\0';
    pcVar11 = (char *)0x0;
    goto LAB_001b715b;
  case 4:
    pcVar12 = "The door locks!";
    pcVar11 = "The door closes!";
  }
  if (bVar8 == '\0') {
    pcVar11 = pcVar12;
  }
LAB_001b715b:
  block_point(x,y);
  *(uint *)&plVar7->locations[x][y].field_0x6 =
       (*(uint *)&plVar7->locations[x][y].field_0x6 & 0xffffff0f) + (uint)(bVar8 == '\0') * 0x40 +
       0x40;
  newsym(x,y);
LAB_001b6ec1:
  bVar5 = false;
  distance = 0;
LAB_001b6eca:
  local_50 = (xchar)x;
  local_4c = (xchar)y;
  if ((pcVar11 != (char *)0x0) && ((viz_array[y][x] & 2U) != 0)) {
    pline(pcVar11);
    puVar1 = &level->locations[x][y].field_0x6;
    *(uint *)puVar1 = *(uint *)puVar1 | 1;
    map_background(local_50,local_4c,1);
  }
  if (bVar5) {
    wake_nearto(x,y,distance);
    pcVar11 = in_rooms(level,local_50,local_4c,0x12);
    if (*pcVar11 != '\0') {
      add_damage(local_50,local_4c,0);
    }
  }
  if (((cVar13 != '\0') && (occupation == picklock)) && (xlock_0 == level->locations[x] + y)) {
    stop_occupation();
    xlock_2 = 0;
    xlock_3 = 0;
    xlock_4 = 0;
    xlock_5 = 0;
    xlock_0 = (rm *)0x0;
    xlock_1 = 0;
    picklock_dy = '\0';
    picklock_dx = '\0';
  }
  return cVar13;
}

Assistant:

boolean doorlock(struct obj *otmp, int x, int y)
{
	struct rm *door = &level->locations[x][y];
	boolean res = TRUE;
	int loudness = 0;
	const char *msg = NULL;
	const char *dustcloud = "A cloud of dust";
	const char *quickly_dissipates = "quickly dissipates";
	int key = artifact_door(level, x, y);	/* ALI - Artifact doors */

	if (door->typ == SDOOR) {
	    switch (otmp->otyp) {
	    case WAN_OPENING:
	    case SPE_KNOCK:
	    case WAN_STRIKING:
	    case SPE_FORCE_BOLT:
		if (key) {
		    /* Artifact doors are revealed only */
		    cvt_sdoor_to_door(door, &u.uz);
		} else {
		    door->typ = DOOR;
		    door->doormask = D_CLOSED | (door->doormask & D_TRAPPED);
		}
		newsym(x,y);
		if (cansee(x,y)) pline("A door appears in the wall!");
		if (otmp->otyp == WAN_OPENING || otmp->otyp == SPE_KNOCK)
		    return TRUE;
		break;		/* striking: continue door handling below */
	    case WAN_LOCKING:
	    case SPE_WIZARD_LOCK:
	    default:
		return FALSE;
	    }
	}

	switch(otmp->otyp) {
	case WAN_LOCKING:
	case SPE_WIZARD_LOCK:
	    if (Is_rogue_level(&u.uz)) {
	    	boolean vis = cansee(x,y);
		/* Can't have real locking in Rogue, so just hide doorway */
		if (vis) pline("%s springs up in the older, more primitive doorway.",
			dustcloud);
		else
			You_hear("a swoosh.");
		if (obstructed(x,y)) {
			if (vis) pline("The cloud %s.",quickly_dissipates);
			return FALSE;
		}
		block_point(x, y);
		door->typ = SDOOR;
		if (vis) pline("The doorway vanishes!");
		newsym(x,y);
		return TRUE;
	    }
	    if (obstructed(x,y)) return FALSE;
	    /* Don't allow doors to close over traps.  This is for pits */
	    /* & trap doors, but is it ever OK for anything else? */
	    if (t_at(level, x, y)) {
		/* maketrap() clears doormask, so it should be NODOOR */
		pline("%s springs up in the doorway, but %s.",
		      dustcloud, quickly_dissipates);
		return FALSE;
	    }

	    switch (door->doormask & ~D_TRAPPED) {
	    case D_CLOSED:
		msg = key ? "The door closes!" :
			    "The door locks!";
		break;
	    case D_ISOPEN:
		msg = key ? "The door swings shut!" :
			    "The door swings shut, and locks!";
		break;
	    case D_BROKEN:
		msg = key ? "The broken door reassembles!" :
			    "The broken door reassembles and locks!";
		break;
	    case D_NODOOR:
		msg =
		"A cloud of dust springs up and assembles itself into a door!";
		break;
	    default:
		res = FALSE;
		break;
	    }
	    block_point(x, y);
	    door->doormask = (key ? D_CLOSED : D_LOCKED) |
			     (door->doormask & D_TRAPPED);
	    newsym(x,y);
	    break;
	case WAN_OPENING:
	case SPE_KNOCK:
	    if (!key && door->doormask & D_LOCKED) {
		msg = "The door unlocks!";
		door->doormask = D_CLOSED | (door->doormask & D_TRAPPED);
	    } else res = FALSE;
	    break;
	case WAN_STRIKING:
	case SPE_FORCE_BOLT:
	    if (!key && door->doormask & (D_LOCKED | D_CLOSED)) {
		if (door->doormask & D_TRAPPED) {
		    if (MON_AT(level, x, y))
			mb_trapped(m_at(level, x,y));
		    else if (flags.verbose) {
			if (cansee(x,y))
			    pline("KABOOM!!  You see a door explode.");
			else if (flags.soundok)
			    You_hear("a distant explosion.");
		    }
		    door->doormask = D_NODOOR;
		    unblock_point(x,y);
		    newsym(x,y);
		    loudness = 40;
		    break;
		}
		door->doormask = D_BROKEN;
		if (flags.verbose) {
		    if (cansee(x,y))
			pline("The door crashes open!");
		    else if (flags.soundok)
			You_hear("a crashing sound.");
		}
		unblock_point(x,y);
		newsym(x,y);
		/* force vision recalc before printing more messages */
		if (vision_full_recalc) vision_recalc(0);
		loudness = 20;
	    } else res = FALSE;
	    break;
	default: warning("magic (%d) attempted on door.", otmp->otyp);
	    break;
	}
	if (msg && cansee(x,y)) {
	    pline(msg);
	    /* we know whether it's locked now */
	    level->locations[x][y].mem_door_l = 1;
	    map_background(x, y, TRUE);
	}
	if (loudness > 0) {
	    /* door was destroyed */
	    wake_nearto(x, y, loudness);
	    if (*in_rooms(level, x, y, SHOPBASE)) add_damage(x, y, 0L);
	}

	if (res && picking_at(x, y)) {
	    /* maybe unseen monster zaps door you're unlocking */
	    stop_occupation();
	    reset_pick();
	}
	return res;
}